

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O0

void __kmp_dispatch_init<long_long>
               (ident_t *loc,int gtid,sched_type schedule,longlong lb,longlong ub,
               signed_t_conflict st,signed_t_conflict chunk,int push_ws)

{
  bool bVar1;
  undefined1 base [16];
  cons_type cVar2;
  long lVar3;
  kmp_uint64 kVar4;
  long lVar5;
  kmp_int64 *pkVar6;
  long lVar7;
  longdouble *plVar8;
  longdouble *__return_storage_ptr__;
  unsigned_t_conflict uVar9;
  long in_RCX;
  char *msg;
  sched_type in_EDX;
  kmp_uint64 kVar10;
  char *in_RSI;
  ident_t *in_RDI;
  long in_R8;
  ulong in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble x_00;
  longdouble in_ST2;
  longdouble lVar11;
  longdouble in_ST3;
  longdouble lVar12;
  longdouble in_ST4;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  long in_stack_00000008;
  int in_stack_00000010;
  longlong *p_1;
  kmp_uint64 schedtype;
  longlong parm4;
  longlong parm3;
  longlong parm2;
  longlong parm1;
  longdouble p;
  UT mid;
  UT right;
  UT left;
  UT cross;
  longdouble target;
  DBL x;
  longlong nproc_3;
  longlong nproc_2;
  longlong nth;
  longlong ub_tmp;
  longlong extras_1;
  longlong small_chunk_1;
  longlong id_1;
  longlong limit;
  longlong init_1;
  longlong nproc_1;
  longlong extras;
  longlong small_chunk;
  longlong id;
  longlong init;
  longlong ntc;
  longlong nproc;
  cons_type ws;
  int itt_need_metadata_reporting;
  kmp_uint64 cur_chunk;
  dispatch_shared_info_template<unsigned_long_long> *sh;
  dispatch_private_info_template<long_long> *pr;
  kmp_uint32 my_buffer_index;
  kmp_team_t *team;
  kmp_info_t *th;
  longlong tc;
  int active;
  ident_t *in_stack_fffffffffffffd18;
  undefined2 in_stack_fffffffffffffd20;
  undefined2 in_stack_fffffffffffffd22;
  int in_stack_fffffffffffffd24;
  ident_t *in_stack_fffffffffffffd28;
  void *in_stack_fffffffffffffd30;
  _func_kmp_uint32_uint_uint *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  uint checker;
  uint *in_stack_fffffffffffffd48;
  unsigned_t_conflict in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  ident_t *in_stack_fffffffffffffd78;
  kmp_int64 kVar16;
  cons_type in_stack_fffffffffffffd80;
  kmp_i18n_id_t in_stack_fffffffffffffd84;
  longlong in_stack_fffffffffffffd88;
  kmp_int64 local_270;
  kmp_uint64 in_stack_fffffffffffffd98;
  kmp_uint64 in_stack_fffffffffffffda0;
  kmp_uint64 in_stack_fffffffffffffda8;
  ident_t *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  bool local_221;
  long local_1a0;
  long local_198;
  long local_190;
  longdouble local_188;
  longdouble *local_170;
  longdouble *local_168;
  kmp_uint64 local_f8;
  kmp_uint64 local_f0;
  ident_t *local_90 [2];
  ident_t *local_80;
  uint local_74;
  kmp_int64 local_70;
  dispatch_shared_info_t *local_68;
  dispatch_private_info_t *local_60;
  uint local_54;
  kmp_team_p *local_50;
  kmp_info_t *local_48;
  kmp_int64 local_40;
  uint local_34;
  ulong local_30;
  long local_28;
  long local_20;
  sched_type local_18;
  int local_14;
  ident_t *local_10;
  
  local_14 = (int)in_RSI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_10 = in_RDI;
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  local_48 = __kmp_threads[local_14];
  local_50 = (local_48->th).th_team;
  local_34 = (uint)(((local_50->t).t_serialized != 0 ^ 0xffU) & 1);
  (local_48->th).th_ident = local_10;
  local_70 = in_stack_00000008;
  local_221 = false;
  if ((((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
       (local_221 = false, __kmp_forkjoin_frames_mode == 3)) &&
      (local_221 = false, *(int *)(__kmp_threads[local_14]->th_pad + 0x20) == 0)) &&
     (local_221 = false, (local_48->th).th_teams_microtask == (microtask_t)0x0)) {
    local_221 = (local_50->t).t_active_level == 1;
  }
  local_74 = (uint)local_221;
  if (local_34 == 0) {
    local_60 = ((local_48->th).th_dispatch)->th_disp_buffer;
  }
  else {
    local_54 = ((local_48->th).th_dispatch)->th_disp_index;
    ((local_48->th).th_dispatch)->th_disp_index = local_54 + 1;
    local_60 = ((local_48->th).th_dispatch)->th_disp_buffer +
               (ulong)local_54 % (ulong)(uint)__kmp_dispatch_num_buffers;
    local_68 = (local_50->t).t_disp_buffer +
               (ulong)local_54 % (ulong)(uint)__kmp_dispatch_num_buffers;
  }
  if ((local_18 & kmp_sch_modifier_nonmonotonic) == 0) {
    local_18 = local_18 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  }
  else {
    local_18 = kmp_sch_static_steal;
  }
  if (((int)local_18 < 0xa0) || (199 < (int)local_18)) {
    local_60->nomerge = 0;
  }
  else {
    local_60->nomerge = 1;
    local_18 = local_18 - 0x80;
  }
  local_60->type_size = 8;
  if ((local_18 & kmp_ord_lower) == 0) {
    local_60->ordered = 0;
  }
  else {
    local_60->ordered = 1;
    local_18 = local_18 - kmp_sch_lower;
  }
  if (local_18 == kmp_sch_default) {
    local_18 = __kmp_static;
  }
  else {
    if (local_18 == kmp_sch_runtime) {
      local_18 = (local_50->t).t_sched.field_0.r_sched_type;
      if (local_18 == kmp_sch_guided_chunked) {
        local_18 = __kmp_guided;
      }
      else if (local_18 == kmp_sch_default) {
        local_18 = __kmp_static;
      }
      in_stack_00000008 = (long)(local_50->t).t_sched.field_0.chunk;
      local_70 = in_stack_00000008;
    }
    else {
      if (local_18 == kmp_sch_guided_chunked) {
        local_18 = __kmp_guided;
      }
      if (in_stack_00000008 < 1) {
        in_stack_00000008 = 1;
      }
    }
    if (local_18 == kmp_sch_auto) {
      local_18 = __kmp_auto;
    }
    if ((local_18 == kmp_sch_guided_analytical_chunked) && (0x100000 < (local_48->th).th_team_nproc)
       ) {
      local_18 = kmp_sch_guided_iterative_chunked;
      in_RSI = (char *)0x40059;
      __kmp_msg_format((uint)local_90);
      in_stack_fffffffffffffd20 = SUB82(local_90[1],0);
      in_stack_fffffffffffffd22 = (undefined2)((ulong)local_90[1] >> 0x10);
      in_stack_fffffffffffffd24 = (int)((ulong)local_90[1] >> 0x20);
      in_stack_fffffffffffffd30 = (void *)__kmp_msg_null._0_8_;
      in_stack_fffffffffffffd38 = (_func_kmp_uint32_uint_uint *)__kmp_msg_null.str;
      in_stack_fffffffffffffd40 = __kmp_msg_null._16_8_;
      __kmp_msg(kmp_ms_warning);
      in_stack_fffffffffffffd18 = local_90[0];
      in_stack_fffffffffffffd28 = local_80;
    }
    if (local_18 == kmp_sch_runtime_simd) {
      local_18 = (local_50->t).t_sched.field_0.r_sched_type;
      if (((local_18 == kmp_sch_default) || (local_18 == kmp_sch_auto)) ||
         (local_18 == __kmp_static)) {
        local_18 = kmp_sch_static_balanced_chunked;
      }
      else {
        if ((local_18 == kmp_sch_guided_chunked) || (local_18 == __kmp_guided)) {
          local_18 = kmp_sch_guided_simd;
        }
        in_stack_00000008 = (local_50->t).t_sched.field_0.chunk * in_stack_00000008;
      }
      local_70 = in_stack_00000008;
    }
    (local_60->u).p64.field_6.parm1 = in_stack_00000008;
  }
  if (((int)local_18 < 0x21) || (0x2f < (int)local_18)) {
    in_RSI = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/daniel-schuermann[P]openmp/runtime/src/kmp_dispatch.cpp"
    ;
    __kmp_debug_assert(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                       (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
  }
  (local_60->u).p64.count = 0;
  if ((__kmp_env_consistency_check != 0) && (local_30 == 0)) {
    in_RSI = (char *)0x2;
    if (local_60->ordered != 0) {
      in_RSI = (char *)0x3;
    }
    __kmp_error_construct
              (in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  if (local_30 == 1) {
    if (local_28 < local_20) {
      local_40 = 0;
    }
    else {
      local_40 = (local_28 - local_20) + 1;
    }
  }
  else if ((long)local_30 < 0) {
    if (local_20 < local_28) {
      local_40 = 0;
    }
    else {
      local_40 = (ulong)(local_20 - local_28) / -local_30 + 1;
    }
  }
  else if (local_28 < local_20) {
    local_40 = 0;
  }
  else {
    local_40 = (ulong)(local_28 - local_20) / local_30 + 1;
  }
  (local_60->u).p64.lb = local_20;
  (local_60->u).p64.ub = local_28;
  (local_60->u).p64.st = local_30;
  (local_60->u).p64.tc = local_40;
  if (local_34 != 0) {
    if (local_60->ordered == 0) {
      ((local_48->th).th_dispatch)->th_deo_fcn = __kmp_dispatch_deo_error;
      ((local_48->th).th_dispatch)->th_dxo_fcn = __kmp_dispatch_dxo_error;
    }
    else {
      local_60->ordered_bumped = 0;
      (local_60->u).p64.ordered_lower = 1;
      (local_60->u).p64.ordered_upper = 0;
      ((local_48->th).th_dispatch)->th_deo_fcn = __kmp_dispatch_deo<unsigned_long_long>;
      ((local_48->th).th_dispatch)->th_dxo_fcn = __kmp_dispatch_dxo<unsigned_long_long>;
    }
  }
  if (__kmp_env_consistency_check != 0) {
    cVar2 = ct_pdo;
    if (local_60->ordered != 0) {
      cVar2 = ct_pdo_ordered;
    }
    if (in_stack_00000010 == 0) {
      in_RSI = (char *)(ulong)cVar2;
      __kmp_check_workshare
                (in_stack_fffffffffffffd24,
                 CONCAT22(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20),
                 in_stack_fffffffffffffd18);
      local_60->pushed_ws = ct_none;
    }
    else {
      in_RSI = (char *)(ulong)cVar2;
      __kmp_push_workshare
                ((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                 (cons_type)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      local_60->pushed_ws = cVar2;
    }
  }
  checker = SUB84(in_stack_fffffffffffffd40,4);
  msg = (char *)(ulong)(local_18 - kmp_sch_static_chunked);
  switch(msg) {
  case (char *)0x0:
  case (char *)0x2:
    if ((local_60->u).p64.field_6.parm1 < 1) {
      (local_60->u).p64.field_6.parm1 = 1;
    }
    break;
  default:
    __kmp_msg_format((uint)&stack0xfffffffffffffe40,0x40058);
    __kmp_msg_format((uint)&stack0xfffffffffffffe28,0x50016);
    __kmp_fatal();
  case (char *)0x6:
    local_190 = in_stack_00000008;
    local_198 = local_40 / (long)((local_48->th).th_team_nproc << 1);
    if (local_198 < 1) {
      local_198 = 1;
    }
    if (in_stack_00000008 < 1) {
      local_190 = 1;
    }
    else if (local_198 < in_stack_00000008) {
      local_190 = local_198;
    }
    local_1a0 = (local_40 * 2 + local_198 + local_190 + -1) / (local_198 + local_190);
    if (local_1a0 < 2) {
      local_1a0 = 2;
    }
    (local_60->u).p64.field_6.parm1 = local_190;
    (local_60->u).p64.field_6.parm2 = local_198;
    (local_60->u).p64.field_6.parm3 = local_1a0;
    (local_60->u).p64.field_6.parm4 = (local_198 - local_190) / (local_1a0 + -1);
    break;
  case (char *)0x7:
    lVar7 = local_40;
    if (1 < (local_48->th).th_team_nproc) {
      lVar7 = (local_40 + (local_48->th).th_team_nproc + -1) / (long)(local_48->th).th_team_nproc;
    }
    (local_60->u).p64.field_6.parm1 = lVar7;
    break;
  case (char *)0x8:
    goto switchD_0017f752_caseD_8;
  case (char *)0x9:
  case (char *)0xd:
    lVar7 = (long)(local_48->th).th_team_nproc;
    if (lVar7 < 2) {
      local_18 = kmp_sch_static_greedy;
      (local_60->u).p64.field_6.parm1 = local_40;
    }
    else if ((in_stack_00000008 * 2 + 1) * lVar7 < local_40) {
      (local_60->u).p64.field_6.parm2 = guided_int_param * lVar7 * (in_stack_00000008 + 1);
      *(double *)((long)&local_60->u + 0x50) = guided_flt_param / (double)lVar7;
    }
    else {
      local_18 = kmp_sch_dynamic_chunked;
    }
    break;
  case (char *)0xa:
    lVar7 = (long)(local_48->th).th_team_nproc;
    if (lVar7 < 2) {
      local_18 = kmp_sch_static_greedy;
      (local_60->u).p64.field_6.parm1 = local_40;
    }
    else if ((in_stack_00000008 * 2 + 1) * lVar7 < local_40) {
      lVar11 = ((longdouble)lVar7 *
               ((longdouble)in_stack_00000008 + (longdouble)in_stack_00000008 + (longdouble)1)) /
               (longdouble)local_40;
      x_00 = (longdouble)-0.5 / (longdouble)lVar7 + (longdouble)1;
      *(longdouble *)((long)&local_60->u + 0x50) = x_00;
      local_170 = (longdouble *)0xe5;
      lVar13 = in_ST4;
      lVar15 = in_ST4;
      __kmp_pow<unsigned_long_long>((longdouble *)0xe5,x_00,(unsigned_long_long)in_RSI);
      local_188 = in_ST0;
      plVar8 = local_170;
      if (in_ST0 <= lVar11) {
        local_168 = (longdouble *)0x0;
      }
      else {
        do {
          local_170 = plVar8;
          local_188 = local_188 * local_188;
          plVar8 = (longdouble *)((long)local_170 << 1);
        } while (lVar11 < local_188 && plVar8 < (longdouble *)0x8000000);
        local_168 = (longdouble *)((ulong)local_170 & 0x7fffffffffffffff);
      }
      while (local_170 = plVar8, lVar14 = lVar15, lVar12 = in_ST4,
            checker = SUB84(in_stack_fffffffffffffd40,4),
            (longdouble *)((long)local_168 + 1U) < local_170) {
        __return_storage_ptr__ = (longdouble *)((ulong)((long)local_168 + (long)local_170) >> 1);
        lVar15 = lVar14;
        __kmp_pow<unsigned_long_long>(__return_storage_ptr__,x_00,(unsigned_long_long)in_RSI);
        bVar1 = lVar11 < in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar12;
        in_ST4 = lVar13;
        lVar13 = lVar14;
        plVar8 = __return_storage_ptr__;
        if (bVar1) {
          plVar8 = local_170;
          local_168 = __return_storage_ptr__;
        }
      }
      if (((local_170 == (longdouble *)0x0) ||
          (__kmp_pow<unsigned_long_long>
                     ((longdouble *)((long)local_170 + -1),x_00,(unsigned_long_long)in_RSI),
          in_ST1 <= lVar11)) ||
         (__kmp_pow<unsigned_long_long>(local_170,x_00,(unsigned_long_long)in_RSI), lVar11 < in_ST2)
         ) {
        __kmp_debug_assert(msg,in_stack_fffffffffffffdb8,
                           (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      }
      (local_60->u).p64.field_6.parm2 = (kmp_int64)local_170;
      base._8_8_ = local_40;
      base._0_8_ = in_stack_fffffffffffffd70;
      kVar16 = local_40;
      uVar9 = __kmp_dispatch_guided_remaining<long_long>
                        (in_stack_fffffffffffffd88,(floating_t_conflict)base,
                         in_stack_fffffffffffffd68);
      (local_60->u).p64.count = (kVar16 - uVar9) - (long)local_170 * in_stack_00000008;
    }
    else {
      local_18 = kmp_sch_dynamic_chunked;
    }
    break;
  case (char *)0xb:
    lVar7 = (long)(local_48->th).th_team_nproc;
    lVar3 = (long)(int)(uint)(local_40 % in_stack_00000008 != 0) + local_40 / in_stack_00000008;
    if ((1 < lVar7) && (lVar7 <= lVar3)) {
      kVar4 = (kmp_uint64)*(int *)(__kmp_threads[local_14]->th_pad + 0x20);
      kVar10 = lVar3 % lVar7;
      in_stack_fffffffffffffdb0 = (ident_t *)(kVar4 * (lVar3 / lVar7));
      in_stack_fffffffffffffda8 = kVar10;
      if ((long)kVar4 < (long)kVar10) {
        in_stack_fffffffffffffda8 = kVar4;
      }
      lVar5 = (long)&in_stack_fffffffffffffdb0->reserved_1 + in_stack_fffffffffffffda8;
      (local_60->u).p64.count = lVar5;
      (local_60->u).p64.ub = lVar5 + lVar3 / lVar7 + (long)(int)(uint)((long)kVar4 < (long)kVar10);
      (local_60->u).p64.field_6.parm2 = local_20;
      (local_60->u).p64.field_6.parm4 = (long)(kVar4 + 1) % lVar7;
      (local_60->u).p64.st = local_30;
      pkVar6 = (kmp_int64 *)
               ___kmp_allocate(CONCAT44(in_stack_fffffffffffffd24,
                                        CONCAT22(in_stack_fffffffffffffd22,in_stack_fffffffffffffd20
                                                )));
      (((local_48->th).th_dispatch)->field_8).th_doacross_info = pkVar6;
      __kmp_init_lock((kmp_lock_t *)0x17f96b);
      break;
    }
    local_18 = kmp_sch_static_balanced;
switchD_0017f752_caseD_8:
    lVar7 = (long)(local_48->th).th_team_nproc;
    if (lVar7 < 2) {
      if (local_40 < 1) {
        (local_60->u).p64.count = 1;
        (local_60->u).p64.field_6.parm1 = 0;
        break;
      }
      local_f0 = 0;
      (local_60->u).p64.field_6.parm1 = 1;
      local_f8 = local_40 - 1;
    }
    else {
      kVar4 = (kmp_uint64)*(int *)(__kmp_threads[local_14]->th_pad + 0x20);
      if (local_40 < lVar7) {
        if (local_40 <= (long)kVar4) {
          (local_60->u).p64.count = 1;
          (local_60->u).p64.field_6.parm1 = 0;
          break;
        }
        *(ulong *)((long)&local_60->u + 0x40) = (ulong)(kVar4 == local_40 - 1U);
        local_f8 = kVar4;
        local_f0 = kVar4;
      }
      else {
        kVar10 = local_40 % lVar7;
        in_stack_fffffffffffffda0 = kVar4 * (local_40 / lVar7);
        in_stack_fffffffffffffd98 = kVar10;
        if ((long)kVar4 < (long)kVar10) {
          in_stack_fffffffffffffd98 = kVar4;
        }
        local_f0 = in_stack_fffffffffffffda0 + in_stack_fffffffffffffd98;
        local_f8 = (local_f0 + local_40 / lVar7) - (long)(int)(uint)((long)kVar10 <= (long)kVar4);
        *(ulong *)((long)&local_60->u + 0x40) = (ulong)(kVar4 == lVar7 - 1U);
      }
    }
    if (local_74 != 0) {
      local_70 = (local_f8 - local_f0) + 1;
    }
    if (local_30 == 1) {
      (local_60->u).p64.lb = local_20 + local_f0;
      (local_60->u).p64.ub = local_20 + local_f8;
    }
    else {
      local_270 = local_20 + local_f8 * local_30;
      (local_60->u).p64.lb = local_20 + local_f0 * local_30;
      if ((long)local_30 < 1) {
        if ((long)(local_270 + local_30) < local_28) {
          local_270 = local_28;
        }
        (local_60->u).p64.ub = local_270;
      }
      else {
        if (local_28 < (long)(local_270 + local_30)) {
          local_270 = local_28;
        }
        (local_60->u).p64.ub = local_270;
      }
    }
    if (local_60->ordered != 0) {
      (local_60->u).p64.ordered_lower = local_f0;
      (local_60->u).p64.ordered_upper = local_f8;
    }
    break;
  case (char *)0xc:
    lVar7 = (long)(local_48->th).th_team_nproc;
    local_18 = kmp_sch_static_greedy;
    if (lVar7 < 2) {
      (local_60->u).p64.field_6.parm1 = local_40;
    }
    else {
      (local_60->u).p64.field_6.parm1 =
           ((local_40 + lVar7 + -1) / lVar7 + in_stack_00000008) - 1U &
           (in_stack_00000008 - 1U ^ 0xffffffffffffffff);
    }
  }
  local_60->schedule = local_18;
  if (local_34 != 0) {
    __kmp_wait_yield<unsigned_int>
              (in_stack_fffffffffffffd48,checker,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30
              );
    ((local_48->th).th_dispatch)->th_dispatch_pr_current = local_60;
    ((local_48->th).th_dispatch)->th_dispatch_sh_current = local_68;
    if (local_60->ordered != 0) {
      __kmp_itt_ordered_init((int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    }
    if (local_74 != 0) {
      switch(local_18) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        break;
      default:
        break;
      case kmp_sch_dynamic_chunked:
        break;
      case kmp_sch_static_greedy:
        local_70 = (local_60->u).p64.field_6.parm1;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
      }
      __kmp_itt_metadata_loop
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98);
    }
  }
  if (local_18 == kmp_sch_static_steal) {
    pkVar6 = &(local_60->u).p64.static_steal_counter;
    *pkVar6 = *pkVar6 + 1;
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(ident_t *loc, int gtid, enum sched_type schedule, T lb,
                    T ub, typename traits_t<T>::signed_t st,
                    typename traits_t<T>::signed_t chunk, int push_ws) {
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::signed_t ST;
  typedef typename traits_t<T>::floating_t DBL;

  int active;
  T tc;
  kmp_info_t *th;
  kmp_team_t *team;
  kmp_uint32 my_buffer_index;
  dispatch_private_info_template<T> *pr;
  dispatch_shared_info_template<UT> volatile *sh;

  KMP_BUILD_ASSERT(sizeof(dispatch_private_info_template<T>) ==
                   sizeof(dispatch_private_info));
  KMP_BUILD_ASSERT(sizeof(dispatch_shared_info_template<UT>) ==
                   sizeof(dispatch_shared_info));

  if (!TCR_4(__kmp_init_parallel))
    __kmp_parallel_initialize();

#if INCLUDE_SSC_MARKS
  SSC_MARK_DISPATCH_INIT();
#endif
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init: T#%%d called: schedule:%%d "
                            "chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
                            traits_t<ST>::spec, traits_t<T>::spec,
                            traits_t<T>::spec, traits_t<ST>::spec);
    KD_TRACE(10, (buff, gtid, schedule, chunk, lb, ub, st));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;
  th->th.th_ident = loc;

#if USE_ITT_BUILD
  kmp_uint64 cur_chunk = chunk;
  int itt_need_metadata_reporting = __itt_metadata_add_ptr &&
                                    __kmp_forkjoin_frames_mode == 3 &&
                                    KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
                                    th->th.th_teams_microtask == NULL &&
#endif
                                    team->t.t_active_level == 1;
#endif
  if (!active) {
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        th->th.th_dispatch->th_disp_buffer); /* top of the stack */
  } else {
    KMP_DEBUG_ASSERT(th->th.th_dispatch ==
                     &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid]);

    my_buffer_index = th->th.th_dispatch->th_disp_index++;

    /* What happens when number of threads changes, need to resize buffer? */
    pr = reinterpret_cast<dispatch_private_info_template<T> *>(
        &th->th.th_dispatch
             ->th_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
    sh = reinterpret_cast<dispatch_shared_info_template<UT> volatile *>(
        &team->t.t_disp_buffer[my_buffer_index % __kmp_dispatch_num_buffers]);
  }

#if (KMP_STATIC_STEAL_ENABLED)
  if (SCHEDULE_HAS_NONMONOTONIC(schedule))
    // AC: we now have only one implementation of stealing, so use it
    schedule = kmp_sch_static_steal;
  else
#endif
    schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

  /* Pick up the nomerge/ordered bits from the scheduling type */
  if ((schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper)) {
    pr->nomerge = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
  } else {
    pr->nomerge = FALSE;
  }
  pr->type_size = traits_t<T>::type_size; // remember the size of variables
  if (kmp_ord_lower & schedule) {
    pr->ordered = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
  } else {
    pr->ordered = FALSE;
  }

  if (schedule == kmp_sch_static) {
    schedule = __kmp_static;
  } else {
    if (schedule == kmp_sch_runtime) {
      // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if
      // not specified)
      schedule = team->t.t_sched.r_sched_type;
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      } else if (schedule == kmp_sch_static) {
        schedule = __kmp_static;
      }
      // Use the chunk size specified by OMP_SCHEDULE (or default if not
      // specified)
      chunk = team->t.t_sched.chunk;
#if USE_ITT_BUILD
      cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d new: schedule:%%d chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    } else {
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      }
      if (chunk <= 0) {
        chunk = KMP_DEFAULT_CHUNK;
      }
    }

    if (schedule == kmp_sch_auto) {
      // mapping and differentiation: in the __kmp_do_serial_initialize()
      schedule = __kmp_auto;
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init: kmp_sch_auto: T#%%d new: "
                                "schedule:%%d chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }

    /* guided analytical not safe for too many threads */
    if (schedule == kmp_sch_guided_analytical_chunked &&
        th->th.th_team_nproc > 1 << 20) {
      schedule = kmp_sch_guided_iterative_chunked;
      KMP_WARNING(DispatchManyThreads);
    }
    if (schedule == kmp_sch_runtime_simd) {
      // compiler provides simd_width in the chunk parameter
      schedule = team->t.t_sched.r_sched_type;
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_static || schedule == kmp_sch_auto ||
          schedule == __kmp_static) {
        schedule = kmp_sch_static_balanced_chunked;
      } else {
        if (schedule == kmp_sch_guided_chunked || schedule == __kmp_guided) {
          schedule = kmp_sch_guided_simd;
        }
        chunk = team->t.t_sched.chunk * chunk;
      }
#if USE_ITT_BUILD
      cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init: T#%%d new: schedule:%%d"
                                " chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
    pr->u.p.parm1 = chunk;
  }
  KMP_ASSERT2((kmp_sch_lower < schedule && schedule < kmp_sch_upper),
              "unknown scheduling type");

  pr->u.p.count = 0;

  if (__kmp_env_consistency_check) {
    if (st == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                            (pr->ordered ? ct_pdo_ordered : ct_pdo), loc);
    }
  }
  // compute trip count
  if (st == 1) { // most common case
    if (ub >= lb) {
      tc = ub - lb + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  } else if (st < 0) {
    if (lb >= ub) {
      // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(lb - ub) / (-st) + 1;
    } else { // lb < ub
      tc = 0; // zero-trip
    }
  } else { // st > 0
    if (ub >= lb) {
      // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(ub - lb) / st + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  }

  // Any half-decent optimizer will remove this test when the blocks are empty
  // since the macros expand to nothing when statistics are disabled.
  if (schedule == __kmp_static) {
    KMP_COUNT_BLOCK(OMP_FOR_static);
    KMP_COUNT_VALUE(FOR_static_iterations, tc);
  } else {
    KMP_COUNT_BLOCK(OMP_FOR_dynamic);
    KMP_COUNT_VALUE(FOR_dynamic_iterations, tc);
  }

  pr->u.p.lb = lb;
  pr->u.p.ub = ub;
  pr->u.p.st = st;
  pr->u.p.tc = tc;

#if KMP_OS_WINDOWS
  pr->u.p.last_upper = ub + st;
#endif /* KMP_OS_WINDOWS */

  /* NOTE: only the active parallel region(s) has active ordered sections */

  if (active) {
    if (pr->ordered == 0) {
      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo_error;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo_error;
    } else {
      pr->ordered_bumped = 0;

      pr->u.p.ordered_lower = 1;
      pr->u.p.ordered_upper = 0;

      th->th.th_dispatch->th_deo_fcn = __kmp_dispatch_deo<UT>;
      th->th.th_dispatch->th_dxo_fcn = __kmp_dispatch_dxo<UT>;
    }
  }

  if (__kmp_env_consistency_check) {
    enum cons_type ws = pr->ordered ? ct_pdo_ordered : ct_pdo;
    if (push_ws) {
      __kmp_push_workshare(gtid, ws, loc);
      pr->pushed_ws = ws;
    } else {
      __kmp_check_workshare(gtid, ws, loc);
      pr->pushed_ws = ct_none;
    }
  }

  switch (schedule) {
#if (KMP_STATIC_STEAL_ENABLED)
  case kmp_sch_static_steal: {
    T nproc = th->th.th_team_nproc;
    T ntc, init;

    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_static_steal case\n", gtid));

    ntc = (tc % chunk ? 1 : 0) + tc / chunk;
    if (nproc > 1 && ntc >= nproc) {
      KMP_COUNT_BLOCK(OMP_FOR_static_steal);
      T id = __kmp_tid_from_gtid(gtid);
      T small_chunk, extras;

      small_chunk = ntc / nproc;
      extras = ntc % nproc;

      init = id * small_chunk + (id < extras ? id : extras);
      pr->u.p.count = init;
      pr->u.p.ub = init + small_chunk + (id < extras ? 1 : 0);

      pr->u.p.parm2 = lb;
      // pr->pfields.parm3 = 0; // it's not used in static_steal
      pr->u.p.parm4 = (id + 1) % nproc; // remember neighbour tid
      pr->u.p.st = st;
      if (traits_t<T>::type_size > 4) {
        // AC: TODO: check if 16-byte CAS available and use it to
        // improve performance (probably wait for explicit request
        // before spending time on this).
        // For now use dynamically allocated per-thread lock,
        // free memory in __kmp_dispatch_next when status==0.
        KMP_DEBUG_ASSERT(th->th.th_dispatch->th_steal_lock == NULL);
        th->th.th_dispatch->th_steal_lock =
            (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(th->th.th_dispatch->th_steal_lock);
      }
      break;
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_balanced\n",
                     gtid));
      schedule = kmp_sch_static_balanced;
      /* too few iterations: fall-through to kmp_sch_static_balanced */
    } // if
    /* FALL-THROUGH to static balanced */
  } // case
#endif
  case kmp_sch_static_balanced: {
    T nproc = th->th.th_team_nproc;
    T init, limit;

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_balanced case\n",
                   gtid));

    if (nproc > 1) {
      T id = __kmp_tid_from_gtid(gtid);

      if (tc < nproc) {
        if (id < tc) {
          init = id;
          limit = id;
          pr->u.p.parm1 = (id == tc - 1); /* parm1 stores *plastiter */
        } else {
          pr->u.p.count = 1; /* means no more chunks to execute */
          pr->u.p.parm1 = FALSE;
          break;
        }
      } else {
        T small_chunk = tc / nproc;
        T extras = tc % nproc;
        init = id * small_chunk + (id < extras ? id : extras);
        limit = init + small_chunk - (id < extras ? 0 : 1);
        pr->u.p.parm1 = (id == nproc - 1);
      }
    } else {
      if (tc > 0) {
        init = 0;
        limit = tc - 1;
        pr->u.p.parm1 = TRUE;
      } else { // zero trip count
        pr->u.p.count = 1; /* means no more chunks to execute */
        pr->u.p.parm1 = FALSE;
        break;
      }
    }
#if USE_ITT_BUILD
    // Calculate chunk for metadata report
    if (itt_need_metadata_reporting)
      cur_chunk = limit - init + 1;
#endif
    if (st == 1) {
      pr->u.p.lb = lb + init;
      pr->u.p.ub = lb + limit;
    } else {
      // calculated upper bound, "ub" is user-defined upper bound
      T ub_tmp = lb + limit * st;
      pr->u.p.lb = lb + init * st;
      // adjust upper bound to "ub" if needed, so that MS lastprivate will match
      // it exactly
      if (st > 0) {
        pr->u.p.ub = (ub_tmp + st > ub ? ub : ub_tmp);
      } else {
        pr->u.p.ub = (ub_tmp + st < ub ? ub : ub_tmp);
      }
    }
    if (pr->ordered) {
      pr->u.p.ordered_lower = init;
      pr->u.p.ordered_upper = limit;
    }
    break;
  } // case
  case kmp_sch_static_balanced_chunked: {
    // similar to balanced, but chunk adjusted to multiple of simd width
    T nth = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d runtime(simd:static)"
                   " -> falling-through to static_greedy\n",
                   gtid));
    schedule = kmp_sch_static_greedy;
    if (nth > 1)
      pr->u.p.parm1 = ((tc + nth - 1) / nth + chunk - 1) & ~(chunk - 1);
    else
      pr->u.p.parm1 = tc;
    break;
  } // case
  case kmp_sch_guided_iterative_chunked:
  case kmp_sch_guided_simd: {
    T nproc = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_iterative_chunked"
                   " case\n",
                   gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        // when remaining iters become less than parm2 - switch to dynamic
        pr->u.p.parm2 = guided_int_param * nproc * (chunk + 1);
        *(double *)&pr->u.p.parm3 =
            guided_flt_param / nproc; // may occupy parm3 and parm4
      }
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",
                     gtid));
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_guided_analytical_chunked: {
    T nproc = th->th.th_team_nproc;
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_analytical_chunked"
                   " case\n",
                   gtid));
    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        DBL x;

#if KMP_OS_WINDOWS && KMP_ARCH_X86
        /* Linux* OS already has 64-bit computation by default for long double,
           and on Windows* OS on Intel(R) 64, /Qlong_double doesn't work. On
           Windows* OS on IA-32 architecture, we need to set precision to 64-bit
           instead of the default 53-bit. Even though long double doesn't work
           on Windows* OS on Intel(R) 64, the resulting lack of precision is not
           expected to impact the correctness of the algorithm, but this has not
           been mathematically proven. */
        // save original FPCW and set precision to 64-bit, as
        // Windows* OS on IA-32 architecture defaults to 53-bit
        unsigned int oldFpcw = _control87(0, 0);
        _control87(_PC_64, _MCW_PC); // 0,0x30000
#endif
        /* value used for comparison in solver for cross-over point */
        long double target = ((long double)chunk * 2 + 1) * nproc / tc;

        /* crossover point--chunk indexes equal to or greater than
           this point switch to dynamic-style scheduling */
        UT cross;

        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        x = (long double)1.0 - (long double)0.5 / nproc;

#ifdef KMP_DEBUG
        { // test natural alignment
          struct _test_a {
            char a;
            union {
              char b;
              DBL d;
            };
          } t;
          ptrdiff_t natural_alignment =
              (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
          //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long
          // long)natural_alignment );
          KMP_DEBUG_ASSERT(
              (((ptrdiff_t)&pr->u.p.parm3) & (natural_alignment)) == 0);
        }
#endif // KMP_DEBUG

        /* save the term in thread private dispatch structure */
        *(DBL *)&pr->u.p.parm3 = x;

        /* solve for the crossover point to the nearest integer i for which C_i
           <= chunk */
        {
          UT left, right, mid;
          long double p;

          /* estimate initial upper and lower bound */

          /* doesn't matter what value right is as long as it is positive, but
             it affects performance of the solver */
          right = 229;
          p = __kmp_pow<UT>(x, right);
          if (p > target) {
            do {
              p *= p;
              right <<= 1;
            } while (p > target && right < (1 << 27));
            /* lower bound is previous (failed) estimate of upper bound */
            left = right >> 1;
          } else {
            left = 0;
          }

          /* bisection root-finding method */
          while (left + 1 < right) {
            mid = (left + right) / 2;
            if (__kmp_pow<UT>(x, mid) > target) {
              left = mid;
            } else {
              right = mid;
            }
          } // while
          cross = right;
        }
        /* assert sanity of computed crossover point */
        KMP_ASSERT(cross && __kmp_pow<UT>(x, cross - 1) > target &&
                   __kmp_pow<UT>(x, cross) <= target);

        /* save the crossover point in thread private dispatch structure */
        pr->u.p.parm2 = cross;

// C75803
#if ((KMP_OS_LINUX || KMP_OS_WINDOWS) && KMP_ARCH_X86) && (!defined(KMP_I8))
#define GUIDED_ANALYTICAL_WORKAROUND (*(DBL *)&pr->u.p.parm3)
#else
#define GUIDED_ANALYTICAL_WORKAROUND (x)
#endif
        /* dynamic-style scheduling offset */
        pr->u.p.count = tc - __kmp_dispatch_guided_remaining(
                                 tc, GUIDED_ANALYTICAL_WORKAROUND, cross) -
                        cross * chunk;
#if KMP_OS_WINDOWS && KMP_ARCH_X86
        // restore FPCW
        _control87(oldFpcw, _MCW_PC);
#endif
      } // if
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_static_greedy:
    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n", gtid));
    pr->u.p.parm1 = (th->th.th_team_nproc > 1)
                        ? (tc + th->th.th_team_nproc - 1) / th->th.th_team_nproc
                        : tc;
    break;
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if (pr->u.p.parm1 <= 0) {
      pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
    }
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d "
                   "kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n",
                   gtid));
    break;
  case kmp_sch_trapezoidal: {
    /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

    T parm1, parm2, parm3, parm4;
    KD_TRACE(100,
             ("__kmp_dispatch_init: T#%d kmp_sch_trapezoidal case\n", gtid));

    parm1 = chunk;

    /* F : size of the first cycle */
    parm2 = (tc / (2 * th->th.th_team_nproc));

    if (parm2 < 1) {
      parm2 = 1;
    }

    /* L : size of the last cycle.  Make sure the last cycle is not larger
       than the first cycle. */
    if (parm1 < 1) {
      parm1 = 1;
    } else if (parm1 > parm2) {
      parm1 = parm2;
    }

    /* N : number of cycles */
    parm3 = (parm2 + parm1);
    parm3 = (2 * tc + parm3 - 1) / parm3;

    if (parm3 < 2) {
      parm3 = 2;
    }

    /* sigma : decreasing incr of the trapezoid */
    parm4 = (parm3 - 1);
    parm4 = (parm2 - parm1) / parm4;

    // pointless check, because parm4 >= 0 always
    // if ( parm4 < 0 ) {
    //    parm4 = 0;
    //}

    pr->u.p.parm1 = parm1;
    pr->u.p.parm2 = parm2;
    pr->u.p.parm3 = parm3;
    pr->u.p.parm4 = parm4;
  } // case
  break;

  default: {
    __kmp_fatal(KMP_MSG(UnknownSchedTypeDetected), // Primary message
                KMP_HNT(GetNewerLibrary), // Hint
                __kmp_msg_null // Variadic argument list terminator
                );
  } break;
  } // switch
  pr->schedule = schedule;
  if (active) {
    /* The name of this buffer should be my_buffer_index when it's free to use
     * it */

    KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));
    __kmp_wait_yield<kmp_uint32>(&sh->buffer_index, my_buffer_index,
                                 __kmp_eq<kmp_uint32> USE_ITT_BUILD_ARG(NULL));
    // Note: KMP_WAIT_YIELD() cannot be used there: buffer index and
    // my_buffer_index are *always* 32-bit integers.
    KMP_MB(); /* is this necessary? */
    KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d "
                   "sh->buffer_index:%d\n",
                   gtid, my_buffer_index, sh->buffer_index));

    th->th.th_dispatch->th_dispatch_pr_current = (dispatch_private_info_t *)pr;
    th->th.th_dispatch->th_dispatch_sh_current =
        CCAST(dispatch_shared_info_t *, (volatile dispatch_shared_info_t *)sh);
#if USE_ITT_BUILD
    if (pr->ordered) {
      __kmp_itt_ordered_init(gtid);
    }
    // Report loop metadata
    if (itt_need_metadata_reporting) {
      // Only report metadata by master of active team at level 1
      kmp_uint64 schedtype = 0;
      switch (schedule) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced: // Chunk is calculated in the switch above
        break;
      case kmp_sch_static_greedy:
        cur_chunk = pr->u.p.parm1;
        break;
      case kmp_sch_dynamic_chunked:
        schedtype = 1;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
      case kmp_sch_guided_simd:
        schedtype = 2;
        break;
      default:
        // Should we put this case under "static"?
        // case kmp_sch_static_steal:
        schedtype = 3;
        break;
      }
      __kmp_itt_metadata_loop(loc, schedtype, tc, cur_chunk);
    }
#endif /* USE_ITT_BUILD */
  }

#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format(
        "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s "
        "lb:%%%s ub:%%%s"
        " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s"
        " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
        traits_t<UT>::spec, traits_t<T>::spec, traits_t<T>::spec,
        traits_t<ST>::spec, traits_t<UT>::spec, traits_t<UT>::spec,
        traits_t<UT>::spec, traits_t<UT>::spec, traits_t<T>::spec,
        traits_t<T>::spec, traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr->schedule, pr->ordered, pr->u.p.lb, pr->u.p.ub,
                  pr->u.p.st, pr->u.p.tc, pr->u.p.count, pr->u.p.ordered_lower,
                  pr->u.p.ordered_upper, pr->u.p.parm1, pr->u.p.parm2,
                  pr->u.p.parm3, pr->u.p.parm4));
    __kmp_str_free(&buff);
  }
#endif
#if (KMP_STATIC_STEAL_ENABLED)
  // It cannot be guaranteed that after execution of a loop with some other
  // schedule kind all the parm3 variables will contain the same value. Even if
  // all parm3 will be the same, it still exists a bad case like using 0 and 1
  // rather than program life-time increment. So the dedicated variable is
  // required. The 'static_steal_counter' is used.
  if (schedule == kmp_sch_static_steal) {
    // Other threads will inspect this variable when searching for a victim.
    // This is a flag showing that other threads may steal from this thread
    // since then.
    volatile T *p = &pr->u.p.static_steal_counter;
    *p = *p + 1;
  }
#endif // ( KMP_STATIC_STEAL_ENABLED )

#if OMPT_SUPPORT && OMPT_OPTIONAL
  if (ompt_enabled.ompt_callback_work) {
    ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
    ompt_task_info_t *task_info = __ompt_get_task_info_object(0);
    kmp_info_t *thr = __kmp_threads[gtid];
    ompt_callbacks.ompt_callback(ompt_callback_work)(
        ompt_work_loop, ompt_scope_begin, &(team_info->parallel_data),
        &(task_info->task_data), tc, OMPT_LOAD_RETURN_ADDRESS(gtid));
  }
#endif
}